

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QList<QByteArray> * __thiscall
QHash<QByteArray,_QTzTimeZone>::keys
          (QList<QByteArray> *__return_storage_ptr__,QHash<QByteArray,_QTzTimeZone> *this)

{
  ulong uVar1;
  ulong uVar2;
  Data *pDVar3;
  key_iterator i1;
  
  pDVar3 = this->d;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else if (pDVar3->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar2 = uVar1;
      if (pDVar3->numBuckets == uVar2) {
        pDVar3 = (Data *)0x0;
        uVar2 = 0;
        break;
      }
      uVar1 = uVar2 + 1;
    } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    goto LAB_00400cc6;
  }
  uVar2 = 0;
LAB_00400cc6:
  i1.i.i.bucket = uVar2;
  i1.i.i.d = pDVar3;
  QList<QByteArray>::QList<QHash<QByteArray,_QTzTimeZone>::key_iterator,_true>
            (__return_storage_ptr__,i1,(key_iterator)ZEXT816(0));
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }